

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

int Dar_CutMergeOrdered(Dar_Cut_t *pC,Dar_Cut_t *pC0,Dar_Cut_t *pC1)

{
  int local_34;
  uint local_30;
  int c;
  int k;
  int i;
  Dar_Cut_t *pC1_local;
  Dar_Cut_t *pC0_local;
  Dar_Cut_t *pC_local;
  
  if (*(uint *)&pC0->field_0x4 >> 0x1d < *(uint *)&pC1->field_0x4 >> 0x1d) {
    __assert_fail("pC0->nLeaves >= pC1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0x10e,"int Dar_CutMergeOrdered(Dar_Cut_t *, Dar_Cut_t *, Dar_Cut_t *)");
  }
  if ((*(uint *)&pC0->field_0x4 >> 0x1d == 4) && (*(uint *)&pC1->field_0x4 >> 0x1d == 4)) {
    if (pC0->uSign == pC1->uSign) {
      for (c = 0; c < (int)(*(uint *)&pC0->field_0x4 >> 0x1d); c = c + 1) {
        if (pC0->pLeaves[c] != pC1->pLeaves[c]) {
          return 0;
        }
      }
      for (c = 0; c < (int)(*(uint *)&pC0->field_0x4 >> 0x1d); c = c + 1) {
        pC->pLeaves[c] = pC0->pLeaves[c];
      }
      *(uint *)&pC->field_0x4 =
           *(uint *)&pC->field_0x4 & 0x1fffffff | *(uint *)&pC0->field_0x4 & 0xe0000000;
      pC_local._4_4_ = 1;
    }
    else {
      pC_local._4_4_ = 0;
    }
  }
  else if (*(uint *)&pC0->field_0x4 >> 0x1d == 4) {
    if ((pC0->uSign & pC1->uSign) == pC1->uSign) {
      for (c = 0; c < (int)(*(uint *)&pC1->field_0x4 >> 0x1d); c = c + 1) {
        local_30 = *(uint *)&pC0->field_0x4 >> 0x1d;
        do {
          local_30 = local_30 - 1;
          if ((int)local_30 < 0) break;
        } while (pC0->pLeaves[(int)local_30] != pC1->pLeaves[c]);
        if (local_30 == 0xffffffff) {
          return 0;
        }
      }
      for (c = 0; c < (int)(*(uint *)&pC0->field_0x4 >> 0x1d); c = c + 1) {
        pC->pLeaves[c] = pC0->pLeaves[c];
      }
      *(uint *)&pC->field_0x4 =
           *(uint *)&pC->field_0x4 & 0x1fffffff | *(uint *)&pC0->field_0x4 & 0xe0000000;
      pC_local._4_4_ = 1;
    }
    else {
      pC_local._4_4_ = 0;
    }
  }
  else {
    local_30 = 0;
    c = 0;
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      if (local_30 == *(uint *)&pC1->field_0x4 >> 0x1d) {
        if (c == *(uint *)&pC0->field_0x4 >> 0x1d) {
          *(uint *)&pC->field_0x4 = *(uint *)&pC->field_0x4 & 0x1fffffff | local_34 << 0x1d;
          return 1;
        }
        pC->pLeaves[local_34] = pC0->pLeaves[c];
        c = c + 1;
      }
      else if (c == *(uint *)&pC0->field_0x4 >> 0x1d) {
        if (local_30 == *(uint *)&pC1->field_0x4 >> 0x1d) {
          *(uint *)&pC->field_0x4 = *(uint *)&pC->field_0x4 & 0x1fffffff | local_34 << 0x1d;
          return 1;
        }
        pC->pLeaves[local_34] = pC1->pLeaves[(int)local_30];
        local_30 = local_30 + 1;
      }
      else if (pC0->pLeaves[c] < pC1->pLeaves[(int)local_30]) {
        pC->pLeaves[local_34] = pC0->pLeaves[c];
        c = c + 1;
      }
      else if (pC1->pLeaves[(int)local_30] < pC0->pLeaves[c]) {
        pC->pLeaves[local_34] = pC1->pLeaves[(int)local_30];
        local_30 = local_30 + 1;
      }
      else {
        pC->pLeaves[local_34] = pC0->pLeaves[c];
        local_30 = local_30 + 1;
        c = c + 1;
      }
    }
    if ((c < (int)(*(uint *)&pC0->field_0x4 >> 0x1d)) ||
       ((int)local_30 < (int)(*(uint *)&pC1->field_0x4 >> 0x1d))) {
      pC_local._4_4_ = 0;
    }
    else {
      *(uint *)&pC->field_0x4 = *(uint *)&pC->field_0x4 & 0x1fffffff | local_34 << 0x1d;
      pC_local._4_4_ = 1;
    }
  }
  return pC_local._4_4_;
}

Assistant:

static inline int Dar_CutMergeOrdered( Dar_Cut_t * pC, Dar_Cut_t * pC0, Dar_Cut_t * pC1 )
{ 
    int i, k, c;
    assert( pC0->nLeaves >= pC1->nLeaves );

    // the case of the largest cut sizes
    if ( pC0->nLeaves == 4 && pC1->nLeaves == 4 )
    {
        if ( pC0->uSign != pC1->uSign )
            return 0;
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            pC->pLeaves[i] = pC0->pLeaves[i];
        pC->nLeaves = pC0->nLeaves;
        return 1;
    }

    // the case when one of the cuts is the largest
    if ( pC0->nLeaves == 4 )
    {
        if ( (pC0->uSign & pC1->uSign) != pC1->uSign )
            return 0;
        for ( i = 0; i < (int)pC1->nLeaves; i++ )
        {
            for ( k = (int)pC0->nLeaves - 1; k >= 0; k-- )
                if ( pC0->pLeaves[k] == pC1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            pC->pLeaves[i] = pC0->pLeaves[i];
        pC->nLeaves = pC0->nLeaves;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < 4; c++ )
    {
        if ( k == (int)pC1->nLeaves )
        {
            if ( i == (int)pC0->nLeaves )
            {
                pC->nLeaves = c;
                return 1;
            }
            pC->pLeaves[c] = pC0->pLeaves[i++];
            continue;
        }
        if ( i == (int)pC0->nLeaves )
        {
            if ( k == (int)pC1->nLeaves )
            {
                pC->nLeaves = c;
                return 1;
            }
            pC->pLeaves[c] = pC1->pLeaves[k++];
            continue;
        }
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c] = pC0->pLeaves[i++];
            continue;
        }
        if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c] = pC1->pLeaves[k++];
            continue;
        }
        pC->pLeaves[c] = pC0->pLeaves[i++]; 
        k++;
    }
    if ( i < (int)pC0->nLeaves || k < (int)pC1->nLeaves )
        return 0;
    pC->nLeaves = c;
    return 1;
}